

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getFloat(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs,
             _func_void_char_ptr_float *check)

{
  Attribute *pAVar1;
  invalid_argument *this;
  double dVar2;
  allocator<char> local_7d;
  float f;
  string local_78 [32];
  SetAttr local_58;
  
  if (*i <= argc + -2) {
    dVar2 = strtod(argv[(long)*i + 1],(char **)0x0);
    f = (float)dVar2;
    if (check != (_func_void_char_ptr_float *)0x0) {
      (*check)(attrName,f);
    }
    std::__cxx11::string::string<std::allocator<char>>(local_78,attrName,&local_7d);
    pAVar1 = (Attribute *)operator_new(0x10);
    Imf_3_2::TypedAttribute<float>::TypedAttribute((float *)pAVar1);
    std::__cxx11::string::string((string *)&local_58,local_78);
    local_58.part = part;
    local_58.attr = pAVar1;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string(local_78);
    *i = *i + 2;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a float");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getFloat (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs,
    void (*check) (const char attrName[], float f) = 0)
{
    if (i > argc - 2)
        throw invalid_argument("Expected a float");

    float f = static_cast<float> (strtod (argv[i + 1], 0));

    if (check) check (attrName, f);

    attrs.push_back (SetAttr (attrName, part, new FloatAttribute (f)));
    i += 2;
}